

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.cc
# Opt level: O1

void __thiscall
dynet::PickBatchElements::backward_dev_impl<dynet::Device_CPU>
          (PickBatchElements *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  int iVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  type local_c0;
  TensorAssignOp<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
  local_98;
  type local_88;
  
  if (this->pval == (uint *)0x0) {
    pvVar2 = this->pvals;
    if ((pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      uVar3 = 0;
      do {
        uVar4 = (ulong)(dEdf->d).nd;
        local_c0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
        local_88.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
        if (uVar4 != 0) {
          uVar6 = 1;
          uVar5 = 0;
          do {
            uVar6 = uVar6 * (dEdf->d).d[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
          local_88.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar6;
        }
        uVar4 = (ulong)(dEdxi->d).nd;
        if (uVar4 != 0) {
          uVar6 = 1;
          uVar5 = 0;
          do {
            uVar6 = uVar6 * (dEdxi->d).d[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
          local_c0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar6;
        }
        local_88.m_rhs_xpr.m_xpr.m_data = dEdf->v;
        local_88.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(dEdf->d).bd;
        local_c0.m_xpr.m_data = dEdxi->v;
        local_c0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(dEdxi->d).bd;
        local_c0.m_offset =
             (Index)(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar3];
        local_88.m_lhs_xpr._32_8_ = local_c0._32_8_;
        local_98.m_lhs_xpr = &local_c0;
        local_98.m_rhs_xpr = &local_88;
        local_88.m_lhs_xpr.m_xpr.m_data = local_c0.m_xpr.m_data;
        local_88.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
             local_c0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0];
        local_88.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
             local_c0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1];
        local_88.m_lhs_xpr.m_offset = local_c0.m_offset;
        local_88.m_rhs_xpr.m_offset = uVar3;
        Eigen::internal::
        TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorChippingOp<1L,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
        ::run(&local_98,dev->edevice);
        uVar3 = (ulong)((int)uVar3 + 1);
        pvVar2 = this->pvals;
      } while (uVar3 < (ulong)((long)(pvVar2->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar2->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 2));
    }
  }
  else {
    uVar3 = (ulong)(dEdf->d).nd;
    iVar1 = 1;
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        iVar1 = iVar1 * (dEdf->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    local_88.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         (long)(iVar1 * (dEdf->d).bd);
    local_88.m_rhs_xpr.m_xpr.m_data = dEdf->v;
    local_c0.m_xpr.m_data = dEdxi->v;
    uVar3 = (ulong)(dEdxi->d).nd;
    if (uVar3 == 0) {
      local_c0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = 1;
    }
    else {
      uVar6 = 1;
      uVar4 = 0;
      do {
        uVar6 = uVar6 * (dEdxi->d).d[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
      local_c0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] = (long)uVar6;
    }
    local_c0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(dEdxi->d).bd;
    local_c0.m_offset = (Index)*this->pval;
    local_98.m_lhs_xpr = &local_c0;
    local_98.m_rhs_xpr = &local_88;
    local_88.m_lhs_xpr.m_xpr.m_data = local_c0.m_xpr.m_data;
    local_88.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_c0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0];
    local_88.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_c0.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1];
    local_88.m_lhs_xpr.m_offset = local_c0.m_offset;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
    ::run((TensorAssignOp<Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorChippingOp<1L,_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
           *)&local_98,dev->edevice);
  }
  return;
}

Assistant:

void PickBatchElements::backward_dev_impl(const MyDevice & dev,
                                  const vector<const Tensor*>& xs,
                                  const Tensor& fx,
                                  const Tensor& dEdf,
                                  unsigned i,
                                  Tensor& dEdxi) const {
  DYNET_ASSERT(i == 0, "Failed dimension check in PickBatchElements::backward");
  if (pval) {
    dEdxi.tbvec().chip<1>(*pval).device(*dev.edevice) += dEdf.tvec();
  } else {
    DYNET_ASSERT(pvals, "Neither single nor vector of elements available in PickBatchElements::backward");
    for (unsigned b = 0; b < pvals->size(); ++b)
      dEdxi.tbvec().chip<1>((*pvals)[b]).device(*dev.edevice) += dEdf.tbvec().chip<1>(b);
  }
}